

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall
ghc::filesystem::path::
path<std::basic_string_view<char,std::char_traits<char>>,ghc::filesystem::path>
          (path *this,string_view *source,format fmt)

{
  format fmt_00;
  string *psVar1;
  ulong uVar2;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  (this->_path)._M_dataplus._M_p = (pointer)&(this->_path).field_2;
  (this->_path)._M_string_length = 0;
  (this->_path).field_2._M_local_buf[0] = '\0';
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,source->_M_str,source->_M_str + source->_M_len);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_48,local_68,local_60 + (long)local_68);
  psVar1 = (string *)local_48;
  std::__cxx11::string::operator=((string *)this,psVar1);
  fmt_00 = (format)psVar1;
  if (local_48[0] != local_38) {
    uVar2 = local_38[0] + 1;
    operator_delete(local_48[0],uVar2);
    fmt_00 = (format)uVar2;
  }
  if (local_68 != local_58) {
    uVar2 = local_58[0] + 1;
    operator_delete(local_68,uVar2);
    fmt_00 = (format)uVar2;
  }
  postprocess_path_with_format(&this->_path,fmt_00);
  return;
}

Assistant:

inline path::path(const std::string_view& source, format fmt)
{
    _path = detail::toUtf8(std::string(source));
    postprocess_path_with_format(_path, fmt);
}